

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O3

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::SimplePrimitive::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,SimplePrimitive *this,Ray *r,
          Float tMax)

{
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_140;
  LightHandle local_138;
  TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  local_130;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_128;
  bool local_28;
  
  ShapeHandle::Intersect
            ((optional<pbrt::ShapeIntersection> *)&local_128.__align,&this->shape,r,tMax);
  if (local_28 == false) {
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  else {
    local_130.bits =
         (this->material).
         super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
         .bits;
    local_138.
    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    .bits = (TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
             )0;
    local_140.bits =
         (r->medium).
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
         .bits;
    SurfaceInteraction::SetIntersectionProperties
              ((SurfaceInteraction *)&local_128.__align,(MaterialHandle *)&local_130,&local_138,
               (MediumInterface *)0x0,(MediumHandle *)&local_140);
    __return_storage_ptr__->set = local_28;
    if (local_28 == true) {
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = local_128._64_8_;
      (__return_storage_ptr__->optionalValue).__align = local_128.__align;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = local_128._8_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = local_128._16_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_128._24_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_128._32_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = local_128._40_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = local_128._48_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = local_128._56_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = local_128._72_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = local_128._128_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = local_128._136_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = local_128._144_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = local_128._152_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = local_128._160_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = local_128._168_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = local_128._176_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = local_128._184_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = local_128._80_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = local_128._88_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = local_128._96_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = local_128._104_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = local_128._112_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = local_128._120_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = local_128._128_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = local_128._136_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = local_128._192_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = local_128._200_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = local_128._208_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = local_128._216_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = local_128._224_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = local_128._232_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = local_128._240_8_;
      *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = local_128._248_4_;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeIntersection> SimplePrimitive::Intersect(const Ray &r,
                                                             Float tMax) const {
    pstd::optional<ShapeIntersection> si = shape.Intersect(r, tMax);
    if (!si)
        return {};

    si->intr.SetIntersectionProperties(material, nullptr, nullptr, r.medium);

    return si;
}